

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler.cc
# Opt level: O0

ProfileHandlerToken * __thiscall
ProfileHandler::RegisterCallback
          (ProfileHandler *this,ProfileHandlerCallback callback,void *callback_arg)

{
  ProfileHandlerToken *pPVar1;
  int in_ECX;
  __off64_t *in_R8;
  size_t in_R9;
  uint in_stack_fffffffffffffee8;
  iterator local_f0;
  _List_const_iterator<ProfileHandlerToken_*> local_e8;
  SpinLockHolder local_e0;
  SpinLockHolder sl;
  ScopedSignalBlocker block;
  SpinLockHolder cl;
  CallbackList copy;
  ProfileHandlerToken *local_28;
  ProfileHandlerToken *token;
  void *callback_arg_local;
  ProfileHandlerCallback callback_local;
  ProfileHandler *this_local;
  
  token = (ProfileHandlerToken *)callback_arg;
  callback_arg_local = callback;
  callback_local = (ProfileHandlerCallback)this;
  pPVar1 = (ProfileHandlerToken *)operator_new(0x10);
  ProfileHandlerToken::ProfileHandlerToken(pPVar1,(ProfileHandlerCallback)callback_arg_local,token);
  local_28 = pPVar1;
  std::__cxx11::list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>::list
            ((list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_> *)&cl);
  std::__cxx11::list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>::push_back
            ((list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_> *)&cl,&local_28);
  SpinLockHolder::SpinLockHolder
            ((SpinLockHolder *)(block.sig_set_.__val + 0xf),&this->control_lock_);
  ScopedSignalBlocker::ScopedSignalBlocker((ScopedSignalBlocker *)&sl,this->signal_number_);
  SpinLockHolder::SpinLockHolder(&local_e0,&this->signal_lock_);
  local_f0._M_node =
       (_List_node_base *)
       std::__cxx11::list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>::end
                 (&this->callbacks_);
  std::_List_const_iterator<ProfileHandlerToken_*>::_List_const_iterator(&local_e8,&local_f0);
  std::__cxx11::list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>::splice
            (&this->callbacks_,(int)local_e8._M_node,(__off64_t *)&cl,in_ECX,in_R8,in_R9,
             in_stack_fffffffffffffee8);
  SpinLockHolder::~SpinLockHolder(&local_e0);
  ScopedSignalBlocker::~ScopedSignalBlocker((ScopedSignalBlocker *)&sl);
  this->callback_count_ = this->callback_count_ + 1;
  UpdateTimer(this,true);
  pPVar1 = local_28;
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)(block.sig_set_.__val + 0xf));
  std::__cxx11::list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>::~list
            ((list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_> *)&cl);
  return pPVar1;
}

Assistant:

ProfileHandlerToken* ProfileHandler::RegisterCallback(
    ProfileHandlerCallback callback, void* callback_arg) {

  ProfileHandlerToken* token = new ProfileHandlerToken(callback, callback_arg);
  CallbackList copy;
  copy.push_back(token);

  SpinLockHolder cl(&control_lock_);
  {
    ScopedSignalBlocker block(signal_number_);
    SpinLockHolder sl(&signal_lock_);
    callbacks_.splice(callbacks_.end(), copy);
  }

  ++callback_count_;
  UpdateTimer(true);
  return token;
}